

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O2

range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t,_tchecker::end_iterator_t> *
tchecker::syncprod::outgoing_synchronized_edges
          (range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t,_tchecker::end_iterator_t>
           *__return_storage_ptr__,system_t *system,
          intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
          *vloc)

{
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
  syncs;
  vloc_synchronized_edges_iterator_t begin;
  undefined1 local_c0 [24];
  const_iterator_t local_a8;
  vloc_synchronized_edges_iterator_t local_a0;
  
  join_0x00000010_0x00000000_ =
       tchecker::system::synchronizations_t::synchronizations
                 (&(system->super_system_t).super_synchronizations_t);
  tchecker::system::edges_t::outgoing_edges_maps((edges_t *)local_c0);
  vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t
            (&local_a0,vloc,(shared_ptr<const_tchecker::system::loc_edges_maps_t> *)local_c0,
             (const_iterator_t *)(local_c0 + 0x10),&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t
            (&__return_storage_ptr__->_begin,&local_a0);
  vloc_synchronized_edges_iterator_t::~vloc_synchronized_edges_iterator_t(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

tchecker::range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t, tchecker::end_iterator_t>
outgoing_synchronized_edges(tchecker::syncprod::system_t const & system,
                            tchecker::intrusive_shared_ptr_t<tchecker::shared_vloc_t const> const & vloc)
{
  auto syncs = system.synchronizations();
  tchecker::syncprod::vloc_synchronized_edges_iterator_t begin(vloc, system.outgoing_edges_maps(), syncs.begin(), syncs.end());

  return tchecker::make_range(begin, tchecker::past_the_end_iterator);
}